

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint __thiscall llvm::dwarf::getOperationEncoding(dwarf *this,StringRef OperationEncodingString)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  uVar2 = 0;
  switch(OperationEncodingString.Data) {
  case (char *)0x8:
    if (*(long *)this == 0x726f5f504f5f5744) {
      uVar2 = 0x21;
    }
    else if (*(long *)this == 0x71655f504f5f5744) {
      uVar2 = 0x29;
    }
    else if (*(long *)this == 0x65675f504f5f5744) {
      uVar2 = 0x2a;
    }
    else if (*(long *)this == 0x74675f504f5f5744) {
      uVar2 = 0x2b;
    }
    else if (*(long *)this == 0x656c5f504f5f5744) {
      uVar2 = 0x2c;
    }
    else if (*(long *)this == 0x746c5f504f5f5744) {
      uVar2 = 0x2d;
    }
    else if (*(long *)this == 0x656e5f504f5f5744) {
      uVar2 = 0x2e;
    }
    break;
  case (char *)0x9:
    if (this[8] == (dwarf)0x70 && *(long *)this == 0x75645f504f5f5744) {
      uVar2 = 0x12;
    }
    else if (this[8] == (dwarf)0x74 && *(long *)this == 0x6f725f504f5f5744) {
      uVar2 = 0x17;
    }
    else if (this[8] == (dwarf)0x73 && *(long *)this == 0x62615f504f5f5744) {
      uVar2 = 0x19;
    }
    else if (this[8] == (dwarf)0x64 && *(long *)this == 0x6e615f504f5f5744) {
      uVar2 = 0x1a;
    }
    else if (this[8] == (dwarf)0x76 && *(long *)this == 0x69645f504f5f5744) {
      uVar2 = 0x1b;
    }
    else if (this[8] == (dwarf)0x64 && *(long *)this == 0x6f6d5f504f5f5744) {
      uVar2 = 0x1d;
    }
    else if (this[8] == (dwarf)0x6c && *(long *)this == 0x756d5f504f5f5744) {
      uVar2 = 0x1e;
    }
    else if (this[8] == (dwarf)0x67 && *(long *)this == 0x656e5f504f5f5744) {
      uVar2 = 0x1f;
    }
    else if (this[8] == (dwarf)0x74 && *(long *)this == 0x6f6e5f504f5f5744) {
      uVar2 = 0x20;
    }
    else if (this[8] == (dwarf)0x6c && *(long *)this == 0x68735f504f5f5744) {
      uVar2 = 0x24;
    }
    else if (this[8] == (dwarf)0x72 && *(long *)this == 0x68735f504f5f5744) {
      uVar2 = 0x25;
    }
    else if (this[8] == (dwarf)0x72 && *(long *)this == 0x6f785f504f5f5744) {
      uVar2 = 0x27;
    }
    else if (this[8] == (dwarf)0x61 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x28;
    }
    else if (this[8] == (dwarf)0x70 && *(long *)this == 0x6f6e5f504f5f5744) {
      uVar2 = 0x96;
    }
    break;
  case (char *)0xa:
    if (*(short *)(this + 8) == 0x7264 && *(long *)this == 0x64615f504f5f5744) {
      uVar2 = 3;
    }
    else if (*(short *)(this + 8) == 0x706f && *(long *)this == 0x72645f504f5f5744) {
      uVar2 = 0x13;
    }
    else if (*(short *)(this + 8) == 0x7265 && *(long *)this == 0x766f5f504f5f5744) {
      uVar2 = 0x14;
    }
    else if (*(short *)(this + 8) == 0x6b63 && *(long *)this == 0x69705f504f5f5744) {
      uVar2 = 0x15;
    }
    else if (*(short *)(this + 8) == 0x7061 && *(long *)this == 0x77735f504f5f5744) {
      uVar2 = 0x16;
    }
    else if (*(short *)(this + 8) == 0x7375 && *(long *)this == 0x6c705f504f5f5744) {
      uVar2 = 0x22;
    }
    else if (*(short *)(this + 8) == 0x6172 && *(long *)this == 0x68735f504f5f5744) {
      uVar2 = 0x26;
    }
    else if (*(short *)(this + 8) == 0x7069 && *(long *)this == 0x6b735f504f5f5744) {
      uVar2 = 0x2f;
    }
    else if (*(short *)(this + 8) == 0x3074 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x30;
    }
    else if (*(short *)(this + 8) == 0x3174 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x31;
    }
    else if (*(short *)(this + 8) == 0x3274 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x32;
    }
    else if (*(short *)(this + 8) == 0x3374 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x33;
    }
    else if (*(short *)(this + 8) == 0x3474 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x34;
    }
    else if (*(short *)(this + 8) == 0x3574 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x35;
    }
    else if (*(short *)(this + 8) == 0x3674 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x36;
    }
    else if (*(short *)(this + 8) == 0x3774 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x37;
    }
    else if (*(short *)(this + 8) == 0x3874 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x38;
    }
    else if (*(short *)(this + 8) == 0x3974 && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x39;
    }
    else if (*(short *)(this + 8) == 0x3067 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x50;
    }
    else if (*(short *)(this + 8) == 0x3167 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x51;
    }
    else if (*(short *)(this + 8) == 0x3267 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x52;
    }
    else if (*(short *)(this + 8) == 0x3367 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x53;
    }
    else if (*(short *)(this + 8) == 0x3467 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x54;
    }
    else if (*(short *)(this + 8) == 0x3567 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x55;
    }
    else if (*(short *)(this + 8) == 0x3667 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x56;
    }
    else if (*(short *)(this + 8) == 0x3767 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x57;
    }
    else if (*(short *)(this + 8) == 0x3867 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x58;
    }
    else if (*(short *)(this + 8) == 0x3967 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x59;
    }
    else if (*(short *)(this + 8) == 0x7867 && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x90;
    }
    break;
  case (char *)0xb:
    if (*(long *)(this + 3) == 0x66657265645f504f && *(long *)this == 0x65645f504f5f5744) {
      uVar2 = 6;
    }
    else if (*(long *)(this + 3) == 0x73756e696d5f504f && *(long *)this == 0x696d5f504f5f5744) {
      uVar2 = 0x1c;
    }
    else if (*(long *)(this + 3) == 0x303174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x3a;
    }
    else if (*(long *)(this + 3) == 0x313174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x3b;
    }
    else if (*(long *)(this + 3) == 0x323174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x3c;
    }
    else if (*(long *)(this + 3) == 0x333174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x3d;
    }
    else if (*(long *)(this + 3) == 0x343174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x3e;
    }
    else if (*(long *)(this + 3) == 0x353174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x3f;
    }
    else if (*(long *)(this + 3) == 0x363174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x40;
    }
    else if (*(long *)(this + 3) == 0x373174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x41;
    }
    else if (*(long *)(this + 3) == 0x383174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x42;
    }
    else if (*(long *)(this + 3) == 0x393174696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x43;
    }
    else if (*(long *)(this + 3) == 0x303274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x44;
    }
    else if (*(long *)(this + 3) == 0x313274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x45;
    }
    else if (*(long *)(this + 3) == 0x323274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x46;
    }
    else if (*(long *)(this + 3) == 0x333274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x47;
    }
    else if (*(long *)(this + 3) == 0x343274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x48;
    }
    else if (*(long *)(this + 3) == 0x353274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x49;
    }
    else if (*(long *)(this + 3) == 0x363274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x4a;
    }
    else if (*(long *)(this + 3) == 0x373274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x4b;
    }
    else if (*(long *)(this + 3) == 0x383274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x4c;
    }
    else if (*(long *)(this + 3) == 0x393274696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x4d;
    }
    else if (*(long *)(this + 3) == 0x303374696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x4e;
    }
    else if (*(long *)(this + 3) == 0x313374696c5f504f && *(long *)this == 0x696c5f504f5f5744) {
      uVar2 = 0x4f;
    }
    else if (*(long *)(this + 3) == 0x30316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x5a;
    }
    else if (*(long *)(this + 3) == 0x31316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x5b;
    }
    else if (*(long *)(this + 3) == 0x32316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x5c;
    }
    else if (*(long *)(this + 3) == 0x33316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x5d;
    }
    else if (*(long *)(this + 3) == 0x34316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x5e;
    }
    else if (*(long *)(this + 3) == 0x35316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x5f;
    }
    else if (*(long *)(this + 3) == 0x36316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x60;
    }
    else if (*(long *)(this + 3) == 0x37316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x61;
    }
    else if (*(long *)(this + 3) == 0x38316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x62;
    }
    else if (*(long *)(this + 3) == 0x39316765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 99;
    }
    else if (*(long *)(this + 3) == 0x30326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 100;
    }
    else if (*(long *)(this + 3) == 0x31326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x65;
    }
    else if (*(long *)(this + 3) == 0x32326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x66;
    }
    else if (*(long *)(this + 3) == 0x33326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x67;
    }
    else if (*(long *)(this + 3) == 0x34326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x68;
    }
    else if (*(long *)(this + 3) == 0x35326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x69;
    }
    else if (*(long *)(this + 3) == 0x36326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x6a;
    }
    else if (*(long *)(this + 3) == 0x37326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x6b;
    }
    else if (*(long *)(this + 3) == 0x38326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x6c;
    }
    else if (*(long *)(this + 3) == 0x39326765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x6d;
    }
    else if (*(long *)(this + 3) == 0x30336765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x6e;
    }
    else if (*(long *)(this + 3) == 0x31336765725f504f && *(long *)this == 0x65725f504f5f5744) {
      uVar2 = 0x6f;
    }
    else if (*(long *)(this + 3) == 0x30676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x70;
    }
    else if (*(long *)(this + 3) == 0x31676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x71;
    }
    else if (*(long *)(this + 3) == 0x32676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x72;
    }
    else if (*(long *)(this + 3) == 0x33676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x73;
    }
    else if (*(long *)(this + 3) == 0x34676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x74;
    }
    else if (*(long *)(this + 3) == 0x35676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x75;
    }
    else if (*(long *)(this + 3) == 0x36676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x76;
    }
    else if (*(long *)(this + 3) == 0x37676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x77;
    }
    else if (*(long *)(this + 3) == 0x38676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x78;
    }
    else if (*(long *)(this + 3) == 0x39676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x79;
    }
    else if (*(long *)(this + 3) == 0x67657262665f504f && *(long *)this == 0x62665f504f5f5744) {
      uVar2 = 0x91;
    }
    else if (*(long *)(this + 3) == 0x78676572625f504f && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x92;
    }
    else if (*(long *)(this + 3) == 0x65636569705f504f && *(long *)this == 0x69705f504f5f5744) {
      uVar2 = 0x93;
    }
    else if (*(long *)(this + 3) == 0x326c6c61635f504f && *(long *)this == 0x61635f504f5f5744) {
      uVar2 = 0x98;
    }
    else if (*(long *)(this + 3) == 0x346c6c61635f504f && *(long *)this == 0x61635f504f5f5744) {
      uVar2 = 0x99;
    }
    else if (*(long *)(this + 3) == 0x78726464615f504f && *(long *)this == 0x64615f504f5f5744) {
      uVar2 = 0xa1;
    }
    break;
  case (char *)0xc:
    if (*(int *)(this + 8) == 0x7574736e && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0x10;
    }
    else if (*(int *)(this + 8) == 0x7374736e && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0x11;
    }
    else if (*(int *)(this + 8) == 0x66657265 && *(long *)this == 0x64785f504f5f5744) {
      uVar2 = 0x18;
    }
    else if (*(int *)(this + 8) == 0x30316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x7a;
    }
    else if (*(int *)(this + 8) == 0x31316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x7b;
    }
    else if (*(int *)(this + 8) == 0x32316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x7c;
    }
    else if (*(int *)(this + 8) == 0x33316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x7d;
    }
    else if (*(int *)(this + 8) == 0x34316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x7e;
    }
    else if (*(int *)(this + 8) == 0x35316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x7f;
    }
    else if (*(int *)(this + 8) == 0x36316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x80;
    }
    else if (*(int *)(this + 8) == 0x37316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x81;
    }
    else if (*(int *)(this + 8) == 0x38316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x82;
    }
    else if (*(int *)(this + 8) == 0x39316765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x83;
    }
    else if (*(int *)(this + 8) == 0x30326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x84;
    }
    else if (*(int *)(this + 8) == 0x31326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x85;
    }
    else if (*(int *)(this + 8) == 0x32326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x86;
    }
    else if (*(int *)(this + 8) == 0x33326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x87;
    }
    else if (*(int *)(this + 8) == 0x34326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x88;
    }
    else if (*(int *)(this + 8) == 0x35326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x89;
    }
    else if (*(int *)(this + 8) == 0x36326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x8a;
    }
    else if (*(int *)(this + 8) == 0x37326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x8b;
    }
    else if (*(int *)(this + 8) == 0x38326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x8c;
    }
    else if (*(int *)(this + 8) == 0x39326765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x8d;
    }
    else if (*(int *)(this + 8) == 0x30336765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x8e;
    }
    else if (*(int *)(this + 8) == 0x31336765 && *(long *)this == 0x72625f504f5f5744) {
      uVar2 = 0x8f;
    }
    else if (*(int *)(this + 8) == 0x7874736e && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xa2;
    }
    break;
  case (char *)0xd:
    if (*(long *)(this + 5) == 0x753174736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 8;
    }
    else if (*(long *)(this + 5) == 0x733174736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 9;
    }
    else if (*(long *)(this + 5) == 0x753274736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 10;
    }
    else if (*(long *)(this + 5) == 0x733274736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xb;
    }
    else if (*(long *)(this + 5) == 0x753474736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xc;
    }
    else if (*(long *)(this + 5) == 0x733474736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xd;
    }
    else if (*(long *)(this + 5) == 0x753874736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xe;
    }
    else if (*(long *)(this + 5) == 0x733874736e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xf;
    }
    else if (*(long *)(this + 5) == 0x747265766e6f635f && *(long *)this == 0x6f635f504f5f5744) {
      uVar2 = 0xa8;
    }
    break;
  case (char *)0xe:
    if (*(long *)(this + 6) == 0x6665725f6c6c6163 && *(long *)this == 0x61635f504f5f5744) {
      uVar2 = 0x9a;
    }
    break;
  case (char *)0xf:
    if (*(long *)(this + 7) == 0x65636569705f7469 && *(long *)this == 0x69625f504f5f5744) {
      uVar2 = 0x9d;
    }
    break;
  case (char *)0x10:
    auVar23[0] = -(*this == (dwarf)'D');
    auVar23[1] = -(this[1] == (dwarf)'W');
    auVar23[2] = -(this[2] == (dwarf)'_');
    auVar23[3] = -(this[3] == (dwarf)'O');
    auVar23[4] = -(this[4] == (dwarf)'P');
    auVar23[5] = -(this[5] == (dwarf)'_');
    auVar23[6] = -(this[6] == (dwarf)'d');
    auVar23[7] = -(this[7] == (dwarf)'e');
    auVar23[8] = -(this[8] == (dwarf)'r');
    auVar23[9] = -(this[9] == (dwarf)'e');
    auVar23[10] = -(this[10] == (dwarf)'f');
    auVar23[0xb] = -(this[0xb] == (dwarf)'_');
    auVar23[0xc] = -(this[0xc] == (dwarf)'s');
    auVar23[0xd] = -(this[0xd] == (dwarf)'i');
    auVar23[0xe] = -(this[0xe] == (dwarf)'z');
    auVar23[0xf] = -(this[0xf] == (dwarf)'e');
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf
                ) == 0xffff) {
      uVar2 = 0x94;
    }
    else {
      auVar24[0] = -(*this == (dwarf)'D');
      auVar24[1] = -(this[1] == (dwarf)'W');
      auVar24[2] = -(this[2] == (dwarf)'_');
      auVar24[3] = -(this[3] == (dwarf)'O');
      auVar24[4] = -(this[4] == (dwarf)'P');
      auVar24[5] = -(this[5] == (dwarf)'_');
      auVar24[6] = -(this[6] == (dwarf)'c');
      auVar24[7] = -(this[7] == (dwarf)'o');
      auVar24[8] = -(this[8] == (dwarf)'n');
      auVar24[9] = -(this[9] == (dwarf)'s');
      auVar24[10] = -(this[10] == (dwarf)'t');
      auVar24[0xb] = -(this[0xb] == (dwarf)'_');
      auVar24[0xc] = -(this[0xc] == (dwarf)'t');
      auVar24[0xd] = -(this[0xd] == (dwarf)'y');
      auVar24[0xe] = -(this[0xe] == (dwarf)'p');
      auVar24[0xf] = -(this[0xf] == (dwarf)'e');
      if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0xa4;
      }
      else {
        auVar25[0] = -(*this == (dwarf)'D');
        auVar25[1] = -(this[1] == (dwarf)'W');
        auVar25[2] = -(this[2] == (dwarf)'_');
        auVar25[3] = -(this[3] == (dwarf)'O');
        auVar25[4] = -(this[4] == (dwarf)'P');
        auVar25[5] = -(this[5] == (dwarf)'_');
        auVar25[6] = -(this[6] == (dwarf)'d');
        auVar25[7] = -(this[7] == (dwarf)'e');
        auVar25[8] = -(this[8] == (dwarf)'r');
        auVar25[9] = -(this[9] == (dwarf)'e');
        auVar25[10] = -(this[10] == (dwarf)'f');
        auVar25[0xb] = -(this[0xb] == (dwarf)'_');
        auVar25[0xc] = -(this[0xc] == (dwarf)'t');
        auVar25[0xd] = -(this[0xd] == (dwarf)'y');
        auVar25[0xe] = -(this[0xe] == (dwarf)'p');
        auVar25[0xf] = -(this[0xf] == (dwarf)'e');
        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
          uVar2 = 0xa6;
        }
      }
    }
    break;
  case (char *)0x11:
    auVar16[0] = -(*this == (dwarf)'D');
    auVar16[1] = -(this[1] == (dwarf)'W');
    auVar16[2] = -(this[2] == (dwarf)'_');
    auVar16[3] = -(this[3] == (dwarf)'O');
    auVar16[4] = -(this[4] == (dwarf)'P');
    auVar16[5] = -(this[5] == (dwarf)'_');
    auVar16[6] = -(this[6] == (dwarf)'p');
    auVar16[7] = -(this[7] == (dwarf)'l');
    auVar16[8] = -(this[8] == (dwarf)'u');
    auVar16[9] = -(this[9] == (dwarf)'s');
    auVar16[10] = -(this[10] == (dwarf)'_');
    auVar16[0xb] = -(this[0xb] == (dwarf)'u');
    auVar16[0xc] = -(this[0xc] == (dwarf)'c');
    auVar16[0xd] = -(this[0xd] == (dwarf)'o');
    auVar16[0xe] = -(this[0xe] == (dwarf)'n');
    auVar16[0xf] = -(this[0xf] == (dwarf)'s');
    auVar40[0] = -(this[0x10] == (dwarf)'t');
    auVar40[1] = 0xff;
    auVar40[2] = 0xff;
    auVar40[3] = 0xff;
    auVar40[4] = 0xff;
    auVar40[5] = 0xff;
    auVar40[6] = 0xff;
    auVar40[7] = 0xff;
    auVar40[8] = 0xff;
    auVar40[9] = 0xff;
    auVar40[10] = 0xff;
    auVar40[0xb] = 0xff;
    auVar40[0xc] = 0xff;
    auVar40[0xd] = 0xff;
    auVar40[0xe] = 0xff;
    auVar40[0xf] = 0xff;
    auVar40 = auVar40 & auVar16;
    if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0x23;
    }
    else {
      auVar17[0] = -(*this == (dwarf)'D');
      auVar17[1] = -(this[1] == (dwarf)'W');
      auVar17[2] = -(this[2] == (dwarf)'_');
      auVar17[3] = -(this[3] == (dwarf)'O');
      auVar17[4] = -(this[4] == (dwarf)'P');
      auVar17[5] = -(this[5] == (dwarf)'_');
      auVar17[6] = -(this[6] == (dwarf)'x');
      auVar17[7] = -(this[7] == (dwarf)'d');
      auVar17[8] = -(this[8] == (dwarf)'e');
      auVar17[9] = -(this[9] == (dwarf)'r');
      auVar17[10] = -(this[10] == (dwarf)'e');
      auVar17[0xb] = -(this[0xb] == (dwarf)'f');
      auVar17[0xc] = -(this[0xc] == (dwarf)'_');
      auVar17[0xd] = -(this[0xd] == (dwarf)'s');
      auVar17[0xe] = -(this[0xe] == (dwarf)'i');
      auVar17[0xf] = -(this[0xf] == (dwarf)'z');
      auVar41[0] = -(this[0x10] == (dwarf)'e');
      auVar41[1] = 0xff;
      auVar41[2] = 0xff;
      auVar41[3] = 0xff;
      auVar41[4] = 0xff;
      auVar41[5] = 0xff;
      auVar41[6] = 0xff;
      auVar41[7] = 0xff;
      auVar41[8] = 0xff;
      auVar41[9] = 0xff;
      auVar41[10] = 0xff;
      auVar41[0xb] = 0xff;
      auVar41[0xc] = 0xff;
      auVar41[0xd] = 0xff;
      auVar41[0xe] = 0xff;
      auVar41[0xf] = 0xff;
      auVar41 = auVar41 & auVar17;
      if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0x95;
      }
      else {
        auVar18[0] = -(*this == (dwarf)'D');
        auVar18[1] = -(this[1] == (dwarf)'W');
        auVar18[2] = -(this[2] == (dwarf)'_');
        auVar18[3] = -(this[3] == (dwarf)'O');
        auVar18[4] = -(this[4] == (dwarf)'P');
        auVar18[5] = -(this[5] == (dwarf)'_');
        auVar18[6] = -(this[6] == (dwarf)'s');
        auVar18[7] = -(this[7] == (dwarf)'t');
        auVar18[8] = -(this[8] == (dwarf)'a');
        auVar18[9] = -(this[9] == (dwarf)'c');
        auVar18[10] = -(this[10] == (dwarf)'k');
        auVar18[0xb] = -(this[0xb] == (dwarf)'_');
        auVar18[0xc] = -(this[0xc] == (dwarf)'v');
        auVar18[0xd] = -(this[0xd] == (dwarf)'a');
        auVar18[0xe] = -(this[0xe] == (dwarf)'l');
        auVar18[0xf] = -(this[0xf] == (dwarf)'u');
        auVar42[0] = -(this[0x10] == (dwarf)'e');
        auVar42[1] = 0xff;
        auVar42[2] = 0xff;
        auVar42[3] = 0xff;
        auVar42[4] = 0xff;
        auVar42[5] = 0xff;
        auVar42[6] = 0xff;
        auVar42[7] = 0xff;
        auVar42[8] = 0xff;
        auVar42[9] = 0xff;
        auVar42[10] = 0xff;
        auVar42[0xb] = 0xff;
        auVar42[0xc] = 0xff;
        auVar42[0xd] = 0xff;
        auVar42[0xe] = 0xff;
        auVar42[0xf] = 0xff;
        auVar42 = auVar42 & auVar18;
        if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) == 0xffff) {
          uVar2 = 0x9f;
        }
        else {
          auVar19[0] = -(*this == (dwarf)'D');
          auVar19[1] = -(this[1] == (dwarf)'W');
          auVar19[2] = -(this[2] == (dwarf)'_');
          auVar19[3] = -(this[3] == (dwarf)'O');
          auVar19[4] = -(this[4] == (dwarf)'P');
          auVar19[5] = -(this[5] == (dwarf)'_');
          auVar19[6] = -(this[6] == (dwarf)'e');
          auVar19[7] = -(this[7] == (dwarf)'n');
          auVar19[8] = -(this[8] == (dwarf)'t');
          auVar19[9] = -(this[9] == (dwarf)'r');
          auVar19[10] = -(this[10] == (dwarf)'y');
          auVar19[0xb] = -(this[0xb] == (dwarf)'_');
          auVar19[0xc] = -(this[0xc] == (dwarf)'v');
          auVar19[0xd] = -(this[0xd] == (dwarf)'a');
          auVar19[0xe] = -(this[0xe] == (dwarf)'l');
          auVar19[0xf] = -(this[0xf] == (dwarf)'u');
          auVar43[0] = -(this[0x10] == (dwarf)'e');
          auVar43[1] = 0xff;
          auVar43[2] = 0xff;
          auVar43[3] = 0xff;
          auVar43[4] = 0xff;
          auVar43[5] = 0xff;
          auVar43[6] = 0xff;
          auVar43[7] = 0xff;
          auVar43[8] = 0xff;
          auVar43[9] = 0xff;
          auVar43[10] = 0xff;
          auVar43[0xb] = 0xff;
          auVar43[0xc] = 0xff;
          auVar43[0xd] = 0xff;
          auVar43[0xe] = 0xff;
          auVar43[0xf] = 0xff;
          auVar43 = auVar43 & auVar19;
          if ((ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) == 0xffff) {
            uVar2 = 0xa3;
          }
          else {
            auVar20[0] = -(*this == (dwarf)'D');
            auVar20[1] = -(this[1] == (dwarf)'W');
            auVar20[2] = -(this[2] == (dwarf)'_');
            auVar20[3] = -(this[3] == (dwarf)'O');
            auVar20[4] = -(this[4] == (dwarf)'P');
            auVar20[5] = -(this[5] == (dwarf)'_');
            auVar20[6] = -(this[6] == (dwarf)'r');
            auVar20[7] = -(this[7] == (dwarf)'e');
            auVar20[8] = -(this[8] == (dwarf)'g');
            auVar20[9] = -(this[9] == (dwarf)'v');
            auVar20[10] = -(this[10] == (dwarf)'a');
            auVar20[0xb] = -(this[0xb] == (dwarf)'l');
            auVar20[0xc] = -(this[0xc] == (dwarf)'_');
            auVar20[0xd] = -(this[0xd] == (dwarf)'t');
            auVar20[0xe] = -(this[0xe] == (dwarf)'y');
            auVar20[0xf] = -(this[0xf] == (dwarf)'p');
            auVar44[0] = -(this[0x10] == (dwarf)'e');
            auVar44[1] = 0xff;
            auVar44[2] = 0xff;
            auVar44[3] = 0xff;
            auVar44[4] = 0xff;
            auVar44[5] = 0xff;
            auVar44[6] = 0xff;
            auVar44[7] = 0xff;
            auVar44[8] = 0xff;
            auVar44[9] = 0xff;
            auVar44[10] = 0xff;
            auVar44[0xb] = 0xff;
            auVar44[0xc] = 0xff;
            auVar44[0xd] = 0xff;
            auVar44[0xe] = 0xff;
            auVar44[0xf] = 0xff;
            auVar44 = auVar44 & auVar20;
            if ((ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) == 0xffff) {
              uVar2 = 0xa5;
            }
            else {
              auVar21[0] = -(*this == (dwarf)'D');
              auVar21[1] = -(this[1] == (dwarf)'W');
              auVar21[2] = -(this[2] == (dwarf)'_');
              auVar21[3] = -(this[3] == (dwarf)'O');
              auVar21[4] = -(this[4] == (dwarf)'P');
              auVar21[5] = -(this[5] == (dwarf)'_');
              auVar21[6] = -(this[6] == (dwarf)'x');
              auVar21[7] = -(this[7] == (dwarf)'d');
              auVar21[8] = -(this[8] == (dwarf)'e');
              auVar21[9] = -(this[9] == (dwarf)'r');
              auVar21[10] = -(this[10] == (dwarf)'e');
              auVar21[0xb] = -(this[0xb] == (dwarf)'f');
              auVar21[0xc] = -(this[0xc] == (dwarf)'_');
              auVar21[0xd] = -(this[0xd] == (dwarf)'t');
              auVar21[0xe] = -(this[0xe] == (dwarf)'y');
              auVar21[0xf] = -(this[0xf] == (dwarf)'p');
              auVar45[0] = -(this[0x10] == (dwarf)'e');
              auVar45[1] = 0xff;
              auVar45[2] = 0xff;
              auVar45[3] = 0xff;
              auVar45[4] = 0xff;
              auVar45[5] = 0xff;
              auVar45[6] = 0xff;
              auVar45[7] = 0xff;
              auVar45[8] = 0xff;
              auVar45[9] = 0xff;
              auVar45[10] = 0xff;
              auVar45[0xb] = 0xff;
              auVar45[0xc] = 0xff;
              auVar45[0xd] = 0xff;
              auVar45[0xe] = 0xff;
              auVar45[0xf] = 0xff;
              auVar45 = auVar45 & auVar21;
              if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) == 0xffff) {
                uVar2 = 0xa7;
              }
              else {
                auVar22[0] = -(*this == (dwarf)'D');
                auVar22[1] = -(this[1] == (dwarf)'W');
                auVar22[2] = -(this[2] == (dwarf)'_');
                auVar22[3] = -(this[3] == (dwarf)'O');
                auVar22[4] = -(this[4] == (dwarf)'P');
                auVar22[5] = -(this[5] == (dwarf)'_');
                auVar22[6] = -(this[6] == (dwarf)'r');
                auVar22[7] = -(this[7] == (dwarf)'e');
                auVar22[8] = -(this[8] == (dwarf)'i');
                auVar22[9] = -(this[9] == (dwarf)'n');
                auVar22[10] = -(this[10] == (dwarf)'t');
                auVar22[0xb] = -(this[0xb] == (dwarf)'e');
                auVar22[0xc] = -(this[0xc] == (dwarf)'r');
                auVar22[0xd] = -(this[0xd] == (dwarf)'p');
                auVar22[0xe] = -(this[0xe] == (dwarf)'r');
                auVar22[0xf] = -(this[0xf] == (dwarf)'e');
                auVar46[0] = -(this[0x10] == (dwarf)'t');
                auVar46[1] = 0xff;
                auVar46[2] = 0xff;
                auVar46[3] = 0xff;
                auVar46[4] = 0xff;
                auVar46[5] = 0xff;
                auVar46[6] = 0xff;
                auVar46[7] = 0xff;
                auVar46[8] = 0xff;
                auVar46[9] = 0xff;
                auVar46[10] = 0xff;
                auVar46[0xb] = 0xff;
                auVar46[0xc] = 0xff;
                auVar46[0xd] = 0xff;
                auVar46[0xe] = 0xff;
                auVar46[0xf] = 0xff;
                auVar46 = auVar46 & auVar22;
                if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) == 0xffff) {
                  uVar2 = 0xa9;
                }
              }
            }
          }
        }
      }
    }
    break;
  case (char *)0x12:
    auVar6[0] = -(*this == (dwarf)'D');
    auVar6[1] = -(this[1] == (dwarf)'W');
    auVar6[2] = -(this[2] == (dwarf)'_');
    auVar6[3] = -(this[3] == (dwarf)'O');
    auVar6[4] = -(this[4] == (dwarf)'P');
    auVar6[5] = -(this[5] == (dwarf)'_');
    auVar6[6] = -(this[6] == (dwarf)'L');
    auVar6[7] = -(this[7] == (dwarf)'L');
    auVar6[8] = -(this[8] == (dwarf)'V');
    auVar6[9] = -(this[9] == (dwarf)'M');
    auVar6[10] = -(this[10] == (dwarf)'_');
    auVar6[0xb] = -(this[0xb] == (dwarf)'c');
    auVar6[0xc] = -(this[0xc] == (dwarf)'o');
    auVar6[0xd] = -(this[0xd] == (dwarf)'n');
    auVar6[0xe] = -(this[0xe] == (dwarf)'v');
    auVar6[0xf] = -(this[0xf] == (dwarf)'e');
    auVar30[0] = -((char)*(undefined2 *)(this + 0x10) == 'r');
    auVar30[1] = -((char)((ushort)*(undefined2 *)(this + 0x10) >> 8) == 't');
    auVar30[2] = 0xff;
    auVar30[3] = 0xff;
    auVar30[4] = 0xff;
    auVar30[5] = 0xff;
    auVar30[6] = 0xff;
    auVar30[7] = 0xff;
    auVar30[8] = 0xff;
    auVar30[9] = 0xff;
    auVar30[10] = 0xff;
    auVar30[0xb] = 0xff;
    auVar30[0xc] = 0xff;
    auVar30[0xd] = 0xff;
    auVar30[0xe] = 0xff;
    auVar30[0xf] = 0xff;
    auVar30 = auVar30 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0x1001;
    }
    break;
  case (char *)0x13:
    auVar34[0] = -(this[3] == (dwarf)'O');
    auVar34[1] = -(this[4] == (dwarf)'P');
    auVar34[2] = -(this[5] == (dwarf)'_');
    auVar34[3] = -(this[6] == (dwarf)'W');
    auVar34[4] = -(this[7] == (dwarf)'A');
    auVar34[5] = -(this[8] == (dwarf)'S');
    auVar34[6] = -(this[9] == (dwarf)'M');
    auVar34[7] = -(this[10] == (dwarf)'_');
    auVar34[8] = -(this[0xb] == (dwarf)'l');
    auVar34[9] = -(this[0xc] == (dwarf)'o');
    auVar34[10] = -(this[0xd] == (dwarf)'c');
    auVar34[0xb] = -(this[0xe] == (dwarf)'a');
    auVar34[0xc] = -(this[0xf] == (dwarf)'t');
    auVar34[0xd] = -(this[0x10] == (dwarf)'i');
    auVar34[0xe] = -(this[0x11] == (dwarf)'o');
    auVar34[0xf] = -(this[0x12] == (dwarf)'n');
    auVar10[0] = -(*this == (dwarf)'D');
    auVar10[1] = -(this[1] == (dwarf)'W');
    auVar10[2] = -(this[2] == (dwarf)'_');
    auVar10[3] = -(this[3] == (dwarf)'O');
    auVar10[4] = -(this[4] == (dwarf)'P');
    auVar10[5] = -(this[5] == (dwarf)'_');
    auVar10[6] = -(this[6] == (dwarf)'W');
    auVar10[7] = -(this[7] == (dwarf)'A');
    auVar10[8] = -(this[8] == (dwarf)'S');
    auVar10[9] = -(this[9] == (dwarf)'M');
    auVar10[10] = -(this[10] == (dwarf)'_');
    auVar10[0xb] = -(this[0xb] == (dwarf)'l');
    auVar10[0xc] = -(this[0xc] == (dwarf)'o');
    auVar10[0xd] = -(this[0xd] == (dwarf)'c');
    auVar10[0xe] = -(this[0xe] == (dwarf)'a');
    auVar10[0xf] = -(this[0xf] == (dwarf)'t');
    auVar10 = auVar10 & auVar34;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0xed;
    }
    else {
      auVar35[0] = -(this[3] == (dwarf)'O');
      auVar35[1] = -(this[4] == (dwarf)'P');
      auVar35[2] = -(this[5] == (dwarf)'_');
      auVar35[3] = -(this[6] == (dwarf)'L');
      auVar35[4] = -(this[7] == (dwarf)'L');
      auVar35[5] = -(this[8] == (dwarf)'V');
      auVar35[6] = -(this[9] == (dwarf)'M');
      auVar35[7] = -(this[10] == (dwarf)'_');
      auVar35[8] = -(this[0xb] == (dwarf)'f');
      auVar35[9] = -(this[0xc] == (dwarf)'r');
      auVar35[10] = -(this[0xd] == (dwarf)'a');
      auVar35[0xb] = -(this[0xe] == (dwarf)'g');
      auVar35[0xc] = -(this[0xf] == (dwarf)'m');
      auVar35[0xd] = -(this[0x10] == (dwarf)'e');
      auVar35[0xe] = -(this[0x11] == (dwarf)'n');
      auVar35[0xf] = -(this[0x12] == (dwarf)'t');
      auVar11[0] = -(*this == (dwarf)'D');
      auVar11[1] = -(this[1] == (dwarf)'W');
      auVar11[2] = -(this[2] == (dwarf)'_');
      auVar11[3] = -(this[3] == (dwarf)'O');
      auVar11[4] = -(this[4] == (dwarf)'P');
      auVar11[5] = -(this[5] == (dwarf)'_');
      auVar11[6] = -(this[6] == (dwarf)'L');
      auVar11[7] = -(this[7] == (dwarf)'L');
      auVar11[8] = -(this[8] == (dwarf)'V');
      auVar11[9] = -(this[9] == (dwarf)'M');
      auVar11[10] = -(this[10] == (dwarf)'_');
      auVar11[0xb] = -(this[0xb] == (dwarf)'f');
      auVar11[0xc] = -(this[0xc] == (dwarf)'r');
      auVar11[0xd] = -(this[0xd] == (dwarf)'a');
      auVar11[0xe] = -(this[0xe] == (dwarf)'g');
      auVar11[0xf] = -(this[0xf] == (dwarf)'m');
      auVar11 = auVar11 & auVar35;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0x1000;
      }
    }
    break;
  case (char *)0x14:
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar31[0] = -((char)uVar1 == '_');
    auVar31[1] = -((char)((uint)uVar1 >> 8) == 'c');
    auVar31[2] = -((char)((uint)uVar1 >> 0x10) == 'f');
    auVar31[3] = -((char)((uint)uVar1 >> 0x18) == 'a');
    auVar31[4] = 0xff;
    auVar31[5] = 0xff;
    auVar31[6] = 0xff;
    auVar31[7] = 0xff;
    auVar31[8] = 0xff;
    auVar31[9] = 0xff;
    auVar31[10] = 0xff;
    auVar31[0xb] = 0xff;
    auVar31[0xc] = 0xff;
    auVar31[0xd] = 0xff;
    auVar31[0xe] = 0xff;
    auVar31[0xf] = 0xff;
    auVar7[0] = -(*this == (dwarf)'D');
    auVar7[1] = -(this[1] == (dwarf)'W');
    auVar7[2] = -(this[2] == (dwarf)'_');
    auVar7[3] = -(this[3] == (dwarf)'O');
    auVar7[4] = -(this[4] == (dwarf)'P');
    auVar7[5] = -(this[5] == (dwarf)'_');
    auVar7[6] = -(this[6] == (dwarf)'c');
    auVar7[7] = -(this[7] == (dwarf)'a');
    auVar7[8] = -(this[8] == (dwarf)'l');
    auVar7[9] = -(this[9] == (dwarf)'l');
    auVar7[10] = -(this[10] == (dwarf)'_');
    auVar7[0xb] = -(this[0xb] == (dwarf)'f');
    auVar7[0xc] = -(this[0xc] == (dwarf)'r');
    auVar7[0xd] = -(this[0xd] == (dwarf)'a');
    auVar7[0xe] = -(this[0xe] == (dwarf)'m');
    auVar7[0xf] = -(this[0xf] == (dwarf)'e');
    auVar7 = auVar7 & auVar31;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0x9c;
    }
    else {
      uVar1 = *(undefined4 *)(this + 0x10);
      auVar32[0] = -((char)uVar1 == 'a');
      auVar32[1] = -((char)((uint)uVar1 >> 8) == 'l');
      auVar32[2] = -((char)((uint)uVar1 >> 0x10) == 'u');
      auVar32[3] = -((char)((uint)uVar1 >> 0x18) == 'e');
      auVar32[4] = 0xff;
      auVar32[5] = 0xff;
      auVar32[6] = 0xff;
      auVar32[7] = 0xff;
      auVar32[8] = 0xff;
      auVar32[9] = 0xff;
      auVar32[10] = 0xff;
      auVar32[0xb] = 0xff;
      auVar32[0xc] = 0xff;
      auVar32[0xd] = 0xff;
      auVar32[0xe] = 0xff;
      auVar32[0xf] = 0xff;
      auVar8[0] = -(*this == (dwarf)'D');
      auVar8[1] = -(this[1] == (dwarf)'W');
      auVar8[2] = -(this[2] == (dwarf)'_');
      auVar8[3] = -(this[3] == (dwarf)'O');
      auVar8[4] = -(this[4] == (dwarf)'P');
      auVar8[5] = -(this[5] == (dwarf)'_');
      auVar8[6] = -(this[6] == (dwarf)'i');
      auVar8[7] = -(this[7] == (dwarf)'m');
      auVar8[8] = -(this[8] == (dwarf)'p');
      auVar8[9] = -(this[9] == (dwarf)'l');
      auVar8[10] = -(this[10] == (dwarf)'i');
      auVar8[0xb] = -(this[0xb] == (dwarf)'c');
      auVar8[0xc] = -(this[0xc] == (dwarf)'i');
      auVar8[0xd] = -(this[0xd] == (dwarf)'t');
      auVar8[0xe] = -(this[0xe] == (dwarf)'_');
      auVar8[0xf] = -(this[0xf] == (dwarf)'v');
      auVar8 = auVar8 & auVar32;
      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0x9e;
      }
      else {
        uVar1 = *(undefined4 *)(this + 0x10);
        auVar33[0] = -((char)uVar1 == 'n');
        auVar33[1] = -((char)((uint)uVar1 >> 8) == 'd');
        auVar33[2] = -((char)((uint)uVar1 >> 0x10) == 'e');
        auVar33[3] = -((char)((uint)uVar1 >> 0x18) == 'x');
        auVar33[4] = 0xff;
        auVar33[5] = 0xff;
        auVar33[6] = 0xff;
        auVar33[7] = 0xff;
        auVar33[8] = 0xff;
        auVar33[9] = 0xff;
        auVar33[10] = 0xff;
        auVar33[0xb] = 0xff;
        auVar33[0xc] = 0xff;
        auVar33[0xd] = 0xff;
        auVar33[0xe] = 0xff;
        auVar33[0xf] = 0xff;
        auVar9[0] = -(*this == (dwarf)'D');
        auVar9[1] = -(this[1] == (dwarf)'W');
        auVar9[2] = -(this[2] == (dwarf)'_');
        auVar9[3] = -(this[3] == (dwarf)'O');
        auVar9[4] = -(this[4] == (dwarf)'P');
        auVar9[5] = -(this[5] == (dwarf)'_');
        auVar9[6] = -(this[6] == (dwarf)'G');
        auVar9[7] = -(this[7] == (dwarf)'N');
        auVar9[8] = -(this[8] == (dwarf)'U');
        auVar9[9] = -(this[9] == (dwarf)'_');
        auVar9[10] = -(this[10] == (dwarf)'a');
        auVar9[0xb] = -(this[0xb] == (dwarf)'d');
        auVar9[0xc] = -(this[0xc] == (dwarf)'d');
        auVar9[0xd] = -(this[0xd] == (dwarf)'r');
        auVar9[0xe] = -(this[0xe] == (dwarf)'_');
        auVar9[0xf] = -(this[0xf] == (dwarf)'i');
        auVar9 = auVar9 & auVar33;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
          uVar2 = 0xfb;
        }
      }
    }
    break;
  case (char *)0x15:
    auVar27[0] = -(this[5] == (dwarf)'_');
    auVar27[1] = -(this[6] == (dwarf)'G');
    auVar27[2] = -(this[7] == (dwarf)'N');
    auVar27[3] = -(this[8] == (dwarf)'U');
    auVar27[4] = -(this[9] == (dwarf)'_');
    auVar27[5] = -(this[10] == (dwarf)'e');
    auVar27[6] = -(this[0xb] == (dwarf)'n');
    auVar27[7] = -(this[0xc] == (dwarf)'t');
    auVar27[8] = -(this[0xd] == (dwarf)'r');
    auVar27[9] = -(this[0xe] == (dwarf)'y');
    auVar27[10] = -(this[0xf] == (dwarf)'_');
    auVar27[0xb] = -(this[0x10] == (dwarf)'v');
    auVar27[0xc] = -(this[0x11] == (dwarf)'a');
    auVar27[0xd] = -(this[0x12] == (dwarf)'l');
    auVar27[0xe] = -(this[0x13] == (dwarf)'u');
    auVar27[0xf] = -(this[0x14] == (dwarf)'e');
    auVar3[0] = -(*this == (dwarf)'D');
    auVar3[1] = -(this[1] == (dwarf)'W');
    auVar3[2] = -(this[2] == (dwarf)'_');
    auVar3[3] = -(this[3] == (dwarf)'O');
    auVar3[4] = -(this[4] == (dwarf)'P');
    auVar3[5] = -(this[5] == (dwarf)'_');
    auVar3[6] = -(this[6] == (dwarf)'G');
    auVar3[7] = -(this[7] == (dwarf)'N');
    auVar3[8] = -(this[8] == (dwarf)'U');
    auVar3[9] = -(this[9] == (dwarf)'_');
    auVar3[10] = -(this[10] == (dwarf)'e');
    auVar3[0xb] = -(this[0xb] == (dwarf)'n');
    auVar3[0xc] = -(this[0xc] == (dwarf)'t');
    auVar3[0xd] = -(this[0xd] == (dwarf)'r');
    auVar3[0xe] = -(this[0xe] == (dwarf)'y');
    auVar3[0xf] = -(this[0xf] == (dwarf)'_');
    auVar3 = auVar3 & auVar27;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0xf3;
    }
    else {
      auVar28[0] = -(this[5] == (dwarf)'_');
      auVar28[1] = -(this[6] == (dwarf)'G');
      auVar28[2] = -(this[7] == (dwarf)'N');
      auVar28[3] = -(this[8] == (dwarf)'U');
      auVar28[4] = -(this[9] == (dwarf)'_');
      auVar28[5] = -(this[10] == (dwarf)'c');
      auVar28[6] = -(this[0xb] == (dwarf)'o');
      auVar28[7] = -(this[0xc] == (dwarf)'n');
      auVar28[8] = -(this[0xd] == (dwarf)'s');
      auVar28[9] = -(this[0xe] == (dwarf)'t');
      auVar28[10] = -(this[0xf] == (dwarf)'_');
      auVar28[0xb] = -(this[0x10] == (dwarf)'i');
      auVar28[0xc] = -(this[0x11] == (dwarf)'n');
      auVar28[0xd] = -(this[0x12] == (dwarf)'d');
      auVar28[0xe] = -(this[0x13] == (dwarf)'e');
      auVar28[0xf] = -(this[0x14] == (dwarf)'x');
      auVar4[0] = -(*this == (dwarf)'D');
      auVar4[1] = -(this[1] == (dwarf)'W');
      auVar4[2] = -(this[2] == (dwarf)'_');
      auVar4[3] = -(this[3] == (dwarf)'O');
      auVar4[4] = -(this[4] == (dwarf)'P');
      auVar4[5] = -(this[5] == (dwarf)'_');
      auVar4[6] = -(this[6] == (dwarf)'G');
      auVar4[7] = -(this[7] == (dwarf)'N');
      auVar4[8] = -(this[8] == (dwarf)'U');
      auVar4[9] = -(this[9] == (dwarf)'_');
      auVar4[10] = -(this[10] == (dwarf)'c');
      auVar4[0xb] = -(this[0xb] == (dwarf)'o');
      auVar4[0xc] = -(this[0xc] == (dwarf)'n');
      auVar4[0xd] = -(this[0xd] == (dwarf)'s');
      auVar4[0xe] = -(this[0xe] == (dwarf)'t');
      auVar4[0xf] = -(this[0xf] == (dwarf)'_');
      auVar4 = auVar4 & auVar28;
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0xfc;
      }
      else {
        auVar29[0] = -(this[5] == (dwarf)'_');
        auVar29[1] = -(this[6] == (dwarf)'L');
        auVar29[2] = -(this[7] == (dwarf)'L');
        auVar29[3] = -(this[8] == (dwarf)'V');
        auVar29[4] = -(this[9] == (dwarf)'M');
        auVar29[5] = -(this[10] == (dwarf)'_');
        auVar29[6] = -(this[0xb] == (dwarf)'t');
        auVar29[7] = -(this[0xc] == (dwarf)'a');
        auVar29[8] = -(this[0xd] == (dwarf)'g');
        auVar29[9] = -(this[0xe] == (dwarf)'_');
        auVar29[10] = -(this[0xf] == (dwarf)'o');
        auVar29[0xb] = -(this[0x10] == (dwarf)'f');
        auVar29[0xc] = -(this[0x11] == (dwarf)'f');
        auVar29[0xd] = -(this[0x12] == (dwarf)'s');
        auVar29[0xe] = -(this[0x13] == (dwarf)'e');
        auVar29[0xf] = -(this[0x14] == (dwarf)'t');
        auVar5[0] = -(*this == (dwarf)'D');
        auVar5[1] = -(this[1] == (dwarf)'W');
        auVar5[2] = -(this[2] == (dwarf)'_');
        auVar5[3] = -(this[3] == (dwarf)'O');
        auVar5[4] = -(this[4] == (dwarf)'P');
        auVar5[5] = -(this[5] == (dwarf)'_');
        auVar5[6] = -(this[6] == (dwarf)'L');
        auVar5[7] = -(this[7] == (dwarf)'L');
        auVar5[8] = -(this[8] == (dwarf)'V');
        auVar5[9] = -(this[9] == (dwarf)'M');
        auVar5[10] = -(this[10] == (dwarf)'_');
        auVar5[0xb] = -(this[0xb] == (dwarf)'t');
        auVar5[0xc] = -(this[0xc] == (dwarf)'a');
        auVar5[0xd] = -(this[0xd] == (dwarf)'g');
        auVar5[0xe] = -(this[0xe] == (dwarf)'_');
        auVar5[0xf] = -(this[0xf] == (dwarf)'o');
        auVar5 = auVar5 & auVar29;
        if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
          uVar2 = 0x1002;
        }
      }
    }
    break;
  case (char *)0x16:
    auVar36[0] = -(this[6] == (dwarf)'f');
    auVar36[1] = -(this[7] == (dwarf)'o');
    auVar36[2] = -(this[8] == (dwarf)'r');
    auVar36[3] = -(this[9] == (dwarf)'m');
    auVar36[4] = -(this[10] == (dwarf)'_');
    auVar36[5] = -(this[0xb] == (dwarf)'t');
    auVar36[6] = -(this[0xc] == (dwarf)'l');
    auVar36[7] = -(this[0xd] == (dwarf)'s');
    auVar36[8] = -(this[0xe] == (dwarf)'_');
    auVar36[9] = -(this[0xf] == (dwarf)'a');
    auVar36[10] = -(this[0x10] == (dwarf)'d');
    auVar36[0xb] = -(this[0x11] == (dwarf)'d');
    auVar36[0xc] = -(this[0x12] == (dwarf)'r');
    auVar36[0xd] = -(this[0x13] == (dwarf)'e');
    auVar36[0xe] = -(this[0x14] == (dwarf)'s');
    auVar36[0xf] = -(this[0x15] == (dwarf)'s');
    auVar12[0] = -(*this == (dwarf)'D');
    auVar12[1] = -(this[1] == (dwarf)'W');
    auVar12[2] = -(this[2] == (dwarf)'_');
    auVar12[3] = -(this[3] == (dwarf)'O');
    auVar12[4] = -(this[4] == (dwarf)'P');
    auVar12[5] = -(this[5] == (dwarf)'_');
    auVar12[6] = -(this[6] == (dwarf)'f');
    auVar12[7] = -(this[7] == (dwarf)'o');
    auVar12[8] = -(this[8] == (dwarf)'r');
    auVar12[9] = -(this[9] == (dwarf)'m');
    auVar12[10] = -(this[10] == (dwarf)'_');
    auVar12[0xb] = -(this[0xb] == (dwarf)'t');
    auVar12[0xc] = -(this[0xc] == (dwarf)'l');
    auVar12[0xd] = -(this[0xd] == (dwarf)'s');
    auVar12[0xe] = -(this[0xe] == (dwarf)'_');
    auVar12[0xf] = -(this[0xf] == (dwarf)'a');
    auVar12 = auVar12 & auVar36;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0x9b;
    }
    else {
      auVar37[0] = -(this[6] == (dwarf)'i');
      auVar37[1] = -(this[7] == (dwarf)'m');
      auVar37[2] = -(this[8] == (dwarf)'p');
      auVar37[3] = -(this[9] == (dwarf)'l');
      auVar37[4] = -(this[10] == (dwarf)'i');
      auVar37[5] = -(this[0xb] == (dwarf)'c');
      auVar37[6] = -(this[0xc] == (dwarf)'i');
      auVar37[7] = -(this[0xd] == (dwarf)'t');
      auVar37[8] = -(this[0xe] == (dwarf)'_');
      auVar37[9] = -(this[0xf] == (dwarf)'p');
      auVar37[10] = -(this[0x10] == (dwarf)'o');
      auVar37[0xb] = -(this[0x11] == (dwarf)'i');
      auVar37[0xc] = -(this[0x12] == (dwarf)'n');
      auVar37[0xd] = -(this[0x13] == (dwarf)'t');
      auVar37[0xe] = -(this[0x14] == (dwarf)'e');
      auVar37[0xf] = -(this[0x15] == (dwarf)'r');
      auVar13[0] = -(*this == (dwarf)'D');
      auVar13[1] = -(this[1] == (dwarf)'W');
      auVar13[2] = -(this[2] == (dwarf)'_');
      auVar13[3] = -(this[3] == (dwarf)'O');
      auVar13[4] = -(this[4] == (dwarf)'P');
      auVar13[5] = -(this[5] == (dwarf)'_');
      auVar13[6] = -(this[6] == (dwarf)'i');
      auVar13[7] = -(this[7] == (dwarf)'m');
      auVar13[8] = -(this[8] == (dwarf)'p');
      auVar13[9] = -(this[9] == (dwarf)'l');
      auVar13[10] = -(this[10] == (dwarf)'i');
      auVar13[0xb] = -(this[0xb] == (dwarf)'c');
      auVar13[0xc] = -(this[0xc] == (dwarf)'i');
      auVar13[0xd] = -(this[0xd] == (dwarf)'t');
      auVar13[0xe] = -(this[0xe] == (dwarf)'_');
      auVar13[0xf] = -(this[0xf] == (dwarf)'p');
      auVar13 = auVar13 & auVar37;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0xa0;
      }
      else {
        auVar38[0] = -(this[6] == (dwarf)'L');
        auVar38[1] = -(this[7] == (dwarf)'L');
        auVar38[2] = -(this[8] == (dwarf)'V');
        auVar38[3] = -(this[9] == (dwarf)'M');
        auVar38[4] = -(this[10] == (dwarf)'_');
        auVar38[5] = -(this[0xb] == (dwarf)'e');
        auVar38[6] = -(this[0xc] == (dwarf)'n');
        auVar38[7] = -(this[0xd] == (dwarf)'t');
        auVar38[8] = -(this[0xe] == (dwarf)'r');
        auVar38[9] = -(this[0xf] == (dwarf)'y');
        auVar38[10] = -(this[0x10] == (dwarf)'_');
        auVar38[0xb] = -(this[0x11] == (dwarf)'v');
        auVar38[0xc] = -(this[0x12] == (dwarf)'a');
        auVar38[0xd] = -(this[0x13] == (dwarf)'l');
        auVar38[0xe] = -(this[0x14] == (dwarf)'u');
        auVar38[0xf] = -(this[0x15] == (dwarf)'e');
        auVar14[0] = -(*this == (dwarf)'D');
        auVar14[1] = -(this[1] == (dwarf)'W');
        auVar14[2] = -(this[2] == (dwarf)'_');
        auVar14[3] = -(this[3] == (dwarf)'O');
        auVar14[4] = -(this[4] == (dwarf)'P');
        auVar14[5] = -(this[5] == (dwarf)'_');
        auVar14[6] = -(this[6] == (dwarf)'L');
        auVar14[7] = -(this[7] == (dwarf)'L');
        auVar14[8] = -(this[8] == (dwarf)'V');
        auVar14[9] = -(this[9] == (dwarf)'M');
        auVar14[10] = -(this[10] == (dwarf)'_');
        auVar14[0xb] = -(this[0xb] == (dwarf)'e');
        auVar14[0xc] = -(this[0xc] == (dwarf)'n');
        auVar14[0xd] = -(this[0xd] == (dwarf)'t');
        auVar14[0xe] = -(this[0xe] == (dwarf)'r');
        auVar14[0xf] = -(this[0xf] == (dwarf)'y');
        auVar14 = auVar14 & auVar38;
        uVar2 = 0x1003;
        if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
          uVar2 = 0;
        }
      }
    }
    break;
  case (char *)0x19:
    auVar39[0] = -(this[9] == (dwarf)'h');
    auVar39[1] = -(this[10] == (dwarf)'_');
    auVar39[2] = -(this[0xb] == (dwarf)'o');
    auVar39[3] = -(this[0xc] == (dwarf)'b');
    auVar39[4] = -(this[0xd] == (dwarf)'j');
    auVar39[5] = -(this[0xe] == (dwarf)'e');
    auVar39[6] = -(this[0xf] == (dwarf)'c');
    auVar39[7] = -(this[0x10] == (dwarf)'t');
    auVar39[8] = -(this[0x11] == (dwarf)'_');
    auVar39[9] = -(this[0x12] == (dwarf)'a');
    auVar39[10] = -(this[0x13] == (dwarf)'d');
    auVar39[0xb] = -(this[0x14] == (dwarf)'d');
    auVar39[0xc] = -(this[0x15] == (dwarf)'r');
    auVar39[0xd] = -(this[0x16] == (dwarf)'e');
    auVar39[0xe] = -(this[0x17] == (dwarf)'s');
    auVar39[0xf] = -(this[0x18] == (dwarf)'s');
    auVar15[0] = -(*this == (dwarf)'D');
    auVar15[1] = -(this[1] == (dwarf)'W');
    auVar15[2] = -(this[2] == (dwarf)'_');
    auVar15[3] = -(this[3] == (dwarf)'O');
    auVar15[4] = -(this[4] == (dwarf)'P');
    auVar15[5] = -(this[5] == (dwarf)'_');
    auVar15[6] = -(this[6] == (dwarf)'p');
    auVar15[7] = -(this[7] == (dwarf)'u');
    auVar15[8] = -(this[8] == (dwarf)'s');
    auVar15[9] = -(this[9] == (dwarf)'h');
    auVar15[10] = -(this[10] == (dwarf)'_');
    auVar15[0xb] = -(this[0xb] == (dwarf)'o');
    auVar15[0xc] = -(this[0xc] == (dwarf)'b');
    auVar15[0xd] = -(this[0xd] == (dwarf)'j');
    auVar15[0xe] = -(this[0xe] == (dwarf)'e');
    auVar15[0xf] = -(this[0xf] == (dwarf)'c');
    auVar15 = auVar15 & auVar39;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0x97;
    }
    break;
  case (char *)0x1a:
    auVar47[0] = -(this[10] == (dwarf)'p');
    auVar47[1] = -(this[0xb] == (dwarf)'u');
    auVar47[2] = -(this[0xc] == (dwarf)'s');
    auVar47[3] = -(this[0xd] == (dwarf)'h');
    auVar47[4] = -(this[0xe] == (dwarf)'_');
    auVar47[5] = -(this[0xf] == (dwarf)'t');
    auVar47[6] = -(this[0x10] == (dwarf)'l');
    auVar47[7] = -(this[0x11] == (dwarf)'s');
    auVar47[8] = -(this[0x12] == (dwarf)'_');
    auVar47[9] = -(this[0x13] == (dwarf)'a');
    auVar47[10] = -(this[0x14] == (dwarf)'d');
    auVar47[0xb] = -(this[0x15] == (dwarf)'d');
    auVar47[0xc] = -(this[0x16] == (dwarf)'r');
    auVar47[0xd] = -(this[0x17] == (dwarf)'e');
    auVar47[0xe] = -(this[0x18] == (dwarf)'s');
    auVar47[0xf] = -(this[0x19] == (dwarf)'s');
    auVar26[0] = -(*this == (dwarf)'D');
    auVar26[1] = -(this[1] == (dwarf)'W');
    auVar26[2] = -(this[2] == (dwarf)'_');
    auVar26[3] = -(this[3] == (dwarf)'O');
    auVar26[4] = -(this[4] == (dwarf)'P');
    auVar26[5] = -(this[5] == (dwarf)'_');
    auVar26[6] = -(this[6] == (dwarf)'G');
    auVar26[7] = -(this[7] == (dwarf)'N');
    auVar26[8] = -(this[8] == (dwarf)'U');
    auVar26[9] = -(this[9] == (dwarf)'_');
    auVar26[10] = -(this[10] == (dwarf)'p');
    auVar26[0xb] = -(this[0xb] == (dwarf)'u');
    auVar26[0xc] = -(this[0xc] == (dwarf)'s');
    auVar26[0xd] = -(this[0xd] == (dwarf)'h');
    auVar26[0xe] = -(this[0xe] == (dwarf)'_');
    auVar26[0xf] = -(this[0xf] == (dwarf)'t');
    auVar26 = auVar26 & auVar47;
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0xe0;
    }
  }
  return uVar2;
}

Assistant:

unsigned llvm::dwarf::getOperationEncoding(StringRef OperationEncodingString) {
  return StringSwitch<unsigned>(OperationEncodingString)
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  .Case("DW_OP_" #NAME, DW_OP_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Case("DW_OP_LLVM_convert", DW_OP_LLVM_convert)
      .Case("DW_OP_LLVM_fragment", DW_OP_LLVM_fragment)
      .Case("DW_OP_LLVM_tag_offset", DW_OP_LLVM_tag_offset)
      .Case("DW_OP_LLVM_entry_value", DW_OP_LLVM_entry_value)
      .Default(0);
}